

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O2

void __thiscall HRSS_Basic_Test::TestBody(HRSS_Basic_Test *this)

{
  uint i;
  int iVar1;
  long lVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  Bytes local_26f0;
  AssertionResult gtest_ar__3;
  AssertHelper local_26d0;
  AssertionResult gtest_ar__2;
  uint8_t shared_key2 [32];
  uint8_t shared_key [32];
  uint8_t ciphertext [1138];
  uint8_t pub_bytes [1138];
  HRSS_public_key pub2;
  uint8_t encap_entropy [1400];
  HRSS_public_key pub;
  uint8_t generate_key_entropy [1432];
  HRSS_private_key priv;
  
  for (lVar2 = 0; lVar2 != 0x598; lVar2 = lVar2 + 1) {
    generate_key_entropy[lVar2] = (uint8_t)lVar2;
  }
  iVar1 = HRSS_generate_key(&pub,&priv,generate_key_entropy);
  this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(encap_entropy + 8);
  encap_entropy[8] = '\0';
  encap_entropy[9] = '\0';
  encap_entropy[10] = '\0';
  encap_entropy[0xb] = '\0';
  encap_entropy[0xc] = '\0';
  encap_entropy[0xd] = '\0';
  encap_entropy[0xe] = '\0';
  encap_entropy[0xf] = '\0';
  encap_entropy[0] = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)pub_bytes);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&pub2,(internal *)encap_entropy,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)ciphertext,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x92,(char *)pub2.opaque._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)ciphertext,(Message *)pub_bytes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)ciphertext);
    std::__cxx11::string::~string((string *)&pub2);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    for (lVar2 = 0; lVar2 != 0x578; lVar2 = lVar2 + 1) {
      encap_entropy[lVar2] = (uint8_t)lVar2;
    }
    HRSS_marshal_public_key(pub_bytes,&pub);
    iVar1 = HRSS_parse_public_key(&pub2,pub_bytes);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(shared_key + 8);
    shared_key[8] = '\0';
    shared_key[9] = '\0';
    shared_key[10] = '\0';
    shared_key[0xb] = '\0';
    shared_key[0xc] = '\0';
    shared_key[0xd] = '\0';
    shared_key[0xe] = '\0';
    shared_key[0xf] = '\0';
    shared_key[0] = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)shared_key2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)ciphertext,(internal *)shared_key,
                 (AssertionResult *)"HRSS_parse_public_key(&pub2, pub_bytes)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x9c,(char *)ciphertext._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)shared_key2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      std::__cxx11::string::~string((string *)ciphertext);
      pub_bytes._0_8_ = shared_key2._0_8_;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      iVar1 = HRSS_encap(ciphertext,shared_key,&pub2,encap_entropy);
      this_00 = &gtest_ar__2.message_;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&gtest_ar__3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)shared_key2,(internal *)&gtest_ar__2,
                   (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_26f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa0,(char *)shared_key2._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_26f0,(Message *)&gtest_ar__3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_26f0);
        std::__cxx11::string::~string((string *)shared_key2);
        pub_bytes._0_8_ = gtest_ar__3._0_8_;
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_00);
        iVar1 = HRSS_decap(shared_key2,&priv,ciphertext,0x472);
        this_00 = &gtest_ar__3.message_;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar1 != 0;
        if (iVar1 != 0) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(this_00);
          gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x20;
          local_26f0.span_.size_ = 0x20;
          local_26f0.span_.data_ = shared_key2;
          gtest_ar__3._0_8_ = shared_key;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar__2,"Bytes(shared_key)","Bytes(shared_key2)",
                     (Bytes *)&gtest_ar__3,&local_26f0);
          if (gtest_ar__2.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__3);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar__2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              message = "";
            }
            else {
              message = *(char **)gtest_ar__2.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_26f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0xa5,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_26f0,(Message *)&gtest_ar__3);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_26f0);
            if (gtest_ar__3._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
            }
          }
          this_00 = &gtest_ar__2.message_;
          goto LAB_002c9aad;
        }
        testing::Message::Message((Message *)&local_26f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2,(internal *)&gtest_ar__3,
                   (AssertionResult *)
                   "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_26d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa3,(char *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_));
        testing::internal::AssertHelper::operator=(&local_26d0,(Message *)&local_26f0);
        testing::internal::AssertHelper::~AssertHelper(&local_26d0);
        std::__cxx11::string::~string((string *)&gtest_ar__2);
        pub_bytes._0_8_ = local_26f0.span_.data_;
      }
    }
  }
  if ((long *)pub_bytes._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)pub_bytes._0_8_ + 8))();
  }
LAB_002c9aad:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(HRSS, Basic) {
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  for (unsigned i = 0; i < sizeof(generate_key_entropy); i++) {
    generate_key_entropy[i] = i;
  }

  HRSS_public_key pub;
  HRSS_private_key priv;
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  for (unsigned i = 0; i < sizeof(encap_entropy); i++) {
    encap_entropy[i] = i;
  }

  HRSS_public_key pub2;
  uint8_t pub_bytes[HRSS_PUBLIC_KEY_BYTES];
  HRSS_marshal_public_key(pub_bytes, &pub);
  ASSERT_TRUE(HRSS_parse_public_key(&pub2, pub_bytes));

  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy));

  uint8_t shared_key2[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));

  EXPECT_EQ(Bytes(shared_key), Bytes(shared_key2));
}